

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int PatchPars(int dummy)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  level_info_t *plVar7;
  char *pcVar8;
  char mapname [8];
  char acStack_38 [8];
  
  DPrintf(4,"[Pars]\n");
LAB_004877a6:
  do {
    while (iVar2 = GetLine(), iVar2 == 1) {
      pcVar5 = "Unknown key in [PARS] section: %s\n";
      pcVar8 = Line1;
LAB_00487858:
      Printf(pcVar5,pcVar8);
    }
    if (iVar2 == 0) {
      return 0;
    }
    iVar3 = strcasecmp("par",Line1);
    pcVar8 = Line2;
    if (iVar3 != 0) {
      return iVar2;
    }
    pcVar5 = strchr(Line2,0x20);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      do {
        pcVar5 = pcVar5 + 1;
        cVar1 = *pcVar5;
        if (cVar1 == '\0') break;
        iVar2 = isspace((int)cVar1);
      } while (iVar2 != 0);
      pcVar6 = strchr(pcVar5,0x20);
      if (pcVar6 == (char *)0x0) {
        iVar2 = atoi(pcVar8);
        mysnprintf(acStack_38,8,"MAP%02d",(ulong)(uint)(iVar2 % 100));
      }
      else {
        mysnprintf(acStack_38,8,"E%cM%c",(ulong)(uint)(int)*pcVar8,(ulong)(uint)(int)cVar1);
        pcVar5 = pcVar6 + 1;
      }
      uVar4 = atoi(pcVar5);
      plVar7 = FindLevelInfo(acStack_38,true);
      if (plVar7 == (level_info_t *)0x0) {
        pcVar5 = "No map %s\n";
        pcVar8 = acStack_38;
        goto LAB_00487858;
      }
      plVar7->partime = uVar4;
      DPrintf(4,"Par for %s changed to %d\n",acStack_38,(ulong)uVar4);
      goto LAB_004877a6;
    }
    Printf("Need data after par.\n");
  } while( true );
}

Assistant:

static int PatchPars (int dummy)
{
	char *space, mapname[8], *moredata;
	level_info_t *info;
	int result, par;

	DPrintf (DMSG_SPAMMY, "[Pars]\n");

	while ( (result = GetLine()) ) {
		// Argh! .bex doesn't follow the same rules as .deh
		if (result == 1) {
			Printf ("Unknown key in [PARS] section: %s\n", Line1);
			continue;
		}
		if (stricmp ("par", Line1))
			return result;

		space = strchr (Line2, ' ');

		if (!space) {
			Printf ("Need data after par.\n");
			continue;
		}

		*space++ = '\0';

		while (*space && isspace(*space))
			space++;

		moredata = strchr (space, ' ');

		if (moredata) {
			// At least 3 items on this line, must be E?M? format
			mysnprintf (mapname, countof(mapname), "E%cM%c", *Line2, *space);
			par = atoi (moredata + 1);
		} else {
			// Only 2 items, must be MAP?? format
			mysnprintf (mapname, countof(mapname), "MAP%02d", atoi(Line2) % 100);
			par = atoi (space);
		}

		if (!(info = FindLevelInfo (mapname)) ) {
			Printf ("No map %s\n", mapname);
			continue;
		}

		info->partime = par;
		DPrintf (DMSG_SPAMMY, "Par for %s changed to %d\n", mapname, par);
	}
	return result;
}